

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFMatrix<long_double>::TPZFMatrix
          (TPZFMatrix<long_double> *this,void **vtt,int64_t rows,int64_t cols,longdouble *buf,
          int64_t sz)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  void **in_RDI;
  void *in_R8;
  void *in_R9;
  int64_t size;
  char *in_stack_00000148;
  char *in_stack_00000150;
  int64_t in_stack_ffffffffffffff98;
  TPZMatrix<long_double> *in_stack_ffffffffffffffb0;
  
  TPZMatrix<long_double>::TPZMatrix
            (in_stack_ffffffffffffffb0,in_RDI,(int64_t)in_RSI,in_stack_ffffffffffffff98);
  *in_RDI = (void *)*in_RSI;
  in_RDI[4] = in_R8;
  in_RDI[5] = in_R8;
  in_RDI[6] = in_R9;
  TPZManVector<int,_5>::TPZManVector((TPZManVector<int,_5> *)(in_RDI + 7),(int64_t)in_RDI);
  TPZVec<long_double>::TPZVec((TPZVec<long_double> *)(in_RDI + 0xe));
  uVar2 = in_RDX * in_RCX;
  if (uVar2 == 0) {
    in_RDI[4] = (void *)0x0;
  }
  else if ((long)in_R9 < (long)uVar2) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    in_RDI[4] = pvVar4;
    if ((in_RDI[4] == (void *)0x0) && (uVar2 != 0)) {
      Error(in_stack_00000150,in_stack_00000148);
    }
  }
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const int64_t rows,const int64_t cols,TVar * buf,const int64_t sz)
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId),TPZMatrix<TVar>( rows, cols ), 
fElem(buf),fGiven(buf),fSize(sz) {
    int64_t size = rows * cols;
    if(size == 0)
    {
        fElem = NULL;
    }
    else if(size > sz)
    {
        fElem=new TVar[size];
#ifndef PZNODEBUG
        if ( fElem == NULL && size) Error( "Constructor <memory allocation error>." );
#endif
    }
}